

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  bool bVar3;
  uint local_58;
  int fSeenFlop;
  int iLitsNew;
  int iLitsOld;
  int iRepr;
  int iPrev;
  int iNext;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vFfIds;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObjR;
  int fUseRiDrivers_local;
  int fFlopsWith_local;
  int fFlopsOnly_local;
  Gia_Man_t *pGia_local;
  
  fSeenFlop = 0;
  local_58 = 0;
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x9c1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(pGia);
  p_00 = Vec_IntStart(iVar1);
  if (fUseRiDrivers == 0) {
    iObj = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(pGia);
      bVar3 = false;
      if (iObj < iVar1) {
        iVar1 = Gia_ManPiNum(pGia);
        vNodes = (Vec_Int_t *)Gia_ManCi(pGia,iVar1 + iObj);
        bVar3 = vNodes != (Vec_Int_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjId(pGia,(Gia_Obj_t *)vNodes);
      Vec_IntWriteEntry(p_00,iVar1,1);
      iObj = iObj + 1;
    }
  }
  else {
    iObj = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(pGia);
      bVar3 = false;
      if (iObj < iVar1) {
        iVar1 = Gia_ManPoNum(pGia);
        vNodes = (Vec_Int_t *)Gia_ManCo(pGia,iVar1 + iObj);
        bVar3 = vNodes != (Vec_Int_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjFaninId0p(pGia,(Gia_Obj_t *)vNodes);
      Vec_IntWriteEntry(p_00,iVar1,1);
      iObj = iObj + 1;
    }
  }
  for (iObj = 1; iVar1 = Gia_ManObjNum(pGia), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Gia_ObjIsConst(pGia,iObj);
    if (iVar1 != 0) {
      fSeenFlop = fSeenFlop + 1;
      if (pGia->pNexts[iObj] != 0) {
        __assert_fail("pGia->pNexts[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x9d3,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
      }
      iVar1 = Vec_IntEntry(p_00,iObj);
      if (iVar1 == 0) {
        Gia_ObjUnsetRepr(pGia,iObj);
      }
      else {
        local_58 = local_58 + 1;
      }
    }
  }
  if (fFlopsOnly == 0) {
    for (iObj = 1; iVar1 = Gia_ManObjNum(pGia), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Gia_ObjIsHead(pGia,iObj);
      if (iVar1 != 0) {
        bVar3 = false;
        iVar1 = Gia_ObjIsHead(pGia,iObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0xa02,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        for (iPrev = iObj; 0 < iPrev; iPrev = Gia_ObjNext(pGia,iPrev)) {
          iVar1 = Vec_IntEntry(p_00,iPrev);
          if (iVar1 != 0) {
            bVar3 = true;
          }
          fSeenFlop = fSeenFlop + 1;
          local_58 = local_58 + 1;
        }
        fSeenFlop = fSeenFlop + -1;
        local_58 = local_58 - 1;
        if (!bVar3) {
          iPrev = iObj;
          iRepr = Gia_ObjNext(pGia,iObj);
          while (iPrev != 0) {
            Gia_ObjUnsetRepr(pGia,iPrev);
            Gia_ObjSetNext(pGia,iPrev,0);
            local_58 = local_58 - 1;
            iPrev = iRepr;
            iRepr = Gia_ObjNext(pGia,iRepr);
          }
          local_58 = local_58 + 1;
          iVar1 = Gia_ObjIsHead(pGia,iObj);
          if (iVar1 != 0) {
            __assert_fail("!Gia_ObjIsHead(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0xa16,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
    }
  }
  else {
    for (iObj = 1; iVar1 = Gia_ManObjNum(pGia), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Gia_ObjIsHead(pGia,iObj);
      if (iVar1 != 0) {
        Vec_IntClear(p);
        iVar1 = Gia_ObjIsHead(pGia,iObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x9df,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        for (iPrev = iObj; 0 < iPrev; iPrev = Gia_ObjNext(pGia,iPrev)) {
          iVar1 = Vec_IntEntry(p_00,iPrev);
          if (iVar1 != 0) {
            Vec_IntPush(p,iPrev);
          }
          fSeenFlop = fSeenFlop + 1;
        }
        fSeenFlop = fSeenFlop + -1;
        iPrev = iObj;
        iRepr = Gia_ObjNext(pGia,iObj);
        while (iPrev != 0) {
          Gia_ObjUnsetRepr(pGia,iPrev);
          Gia_ObjSetNext(pGia,iPrev,0);
          iPrev = iRepr;
          iRepr = Gia_ObjNext(pGia,iRepr);
        }
        iVar1 = Gia_ObjIsHead(pGia,iObj);
        if (iVar1 != 0) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x9ed,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar1 = Vec_IntSize(p);
        if (1 < iVar1) {
          iVar1 = Vec_IntEntry(p,0);
          iLitsOld = iVar1;
          for (iNext = 1; iVar2 = Vec_IntSize(p), iNext < iVar2; iNext = iNext + 1) {
            iVar2 = Vec_IntEntry(p,iNext);
            Gia_ObjSetRepr(pGia,iVar2,iVar1);
            Gia_ObjSetNext(pGia,iLitsOld,iVar2);
            local_58 = local_58 + 1;
            iLitsOld = iVar2;
          }
          iVar1 = Gia_ObjNext(pGia,iLitsOld);
          if (iVar1 != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x9f9,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)(uint)fSeenFlop,
            (ulong)local_58);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}